

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

void __thiscall cimg_library::cimg::X11_static::X11_static(X11_static *this)

{
  CImgDisplay **ppCVar1;
  
  this->nb_wins = 0;
  this->events_thread = (pthread_t *)0x0;
  this->display = (Display *)0x0;
  *(undefined8 *)((long)&this->display + 7) = 0;
  ppCVar1 = (CImgDisplay **)operator_new__(0x2000);
  this->wins = ppCVar1;
  pthread_mutex_init((pthread_mutex_t *)&this->wait_event_mutex,(pthread_mutexattr_t *)0x0);
  pthread_cond_init((pthread_cond_t *)&this->wait_event,(pthread_condattr_t *)0x0);
  return;
}

Assistant:

X11_static():nb_wins(0),events_thread(0),display(0),
                 nb_bits(0),is_blue_first(false),is_shm_enabled(false),byte_order(false) {
#ifdef __FreeBSD__
        XInitThreads();
#endif
        wins = new CImgDisplay*[1024];
        pthread_mutex_init(&wait_event_mutex,0);
        pthread_cond_init(&wait_event,0);

#ifdef cimg_use_xrandr
        resolutions = 0;
        curr_rotation = 0;
        curr_resolution = nb_resolutions = 0;
#endif
      }